

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choc_Value.h
# Opt level: O2

void __thiscall
choc::value::Type::ComplexArray::ComplexArray(ComplexArray *this,Allocator *a,ComplexArray *other)

{
  long lVar1;
  RepeatedGroup *other_00;
  RepeatedGroup RStack_58;
  
  (this->groups).items = (RepeatedGroup *)0x0;
  (this->groups).size = 0;
  (this->groups).capacity = 0;
  (this->groups).allocator = a;
  AllocatedVector<choc::value::Type::ComplexArray::RepeatedGroup>::reserve
            (&this->groups,(other->groups).size);
  other_00 = (other->groups).items;
  for (lVar1 = (ulong)(other->groups).size * 0x28; lVar1 != 0; lVar1 = lVar1 + -0x28) {
    RepeatedGroup::RepeatedGroup(&RStack_58,a,other_00);
    AllocatedVector<choc::value::Type::ComplexArray::RepeatedGroup>::push_back
              (&this->groups,&RStack_58);
    deleteAllocatedObjects(&RStack_58.elementType);
    other_00 = other_00 + 1;
  }
  return;
}

Assistant:

ComplexArray (Allocator* a, const ComplexArray& other) : groups (a)
    {
        groups.reserve (other.groups.size);

        for (auto& g : other.groups)
            groups.push_back ({ a, g });
    }